

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

int __thiscall model::load_model(model *this,string *file_path)

{
  pointer pcVar1;
  pointer pfVar2;
  int iVar3;
  FILE *__stream;
  unsigned_long uVar4;
  vector<float,_std::allocator<float>_> intercepts;
  vector<float,_std::allocator<float>_> params;
  char buff1 [512];
  char buff2 [1000000];
  pointer in_stack_fffffffffff0bb48;
  pointer in_stack_fffffffffff0bb50;
  pointer in_stack_fffffffffff0bb58;
  float *in_stack_fffffffffff0bb68;
  float *in_stack_fffffffffff0bb80;
  
  __stream = fopen((file_path->_M_dataplus)._M_p,"r");
  pcVar1 = (file_path->_M_dataplus)._M_p;
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file %s to read!\n",pcVar1);
    iVar3 = 1;
  }
  else {
    printf("Load model from %s\n",pcVar1);
    fgets(&stack0xfffffffffff0bb98,0x1ff,__stream);
    uVar4 = atol(&stack0xfffffffffff0bb98);
    this->num_features = uVar4;
    fgets(&stack0xfffffffffff0bb98,0x1ff,__stream);
    readFromSep<float>((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb80,
                       &stack0xfffffffffff0bb98,' ');
    this->alpha = *in_stack_fffffffffff0bb80;
    this->beta = in_stack_fffffffffff0bb80[1];
    this->lambda1 = in_stack_fffffffffff0bb80[2];
    this->lambda2 = in_stack_fffffffffff0bb80[3];
    init_model(this);
    fgets(&stack0xfffffffffff0bb98,0x1ff,__stream);
    readFromSep<float>((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb68,
                       &stack0xfffffffffff0bb98,' ');
    this->z_intercept = *in_stack_fffffffffff0bb68;
    this->n_intercept = in_stack_fffffffffff0bb68[1];
    this->w_intercept = in_stack_fffffffffff0bb68[2];
    fgets(&stack0xfffffffffff0bd98,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb48,
               &stack0xfffffffffff0bd98,this->num_features);
    pfVar2 = (this->z).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->z).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = in_stack_fffffffffff0bb48;
    (this->z).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = in_stack_fffffffffff0bb50;
    (this->z).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_stack_fffffffffff0bb58;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2);
    }
    fgets(&stack0xfffffffffff0bd98,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb48,
               &stack0xfffffffffff0bd98,this->num_features);
    pfVar2 = (this->n).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->n).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->n).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this->n).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2);
    }
    fgets(&stack0xfffffffffff0bd98,999999,__stream);
    libsvm2sparse<float>
              ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffff0bb48,
               &stack0xfffffffffff0bd98,this->num_features);
    pfVar2 = (this->w).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->w).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->w).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this->w).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2);
    }
    fclose(__stream);
    if (in_stack_fffffffffff0bb68 != (float *)0x0) {
      operator_delete(in_stack_fffffffffff0bb68);
    }
    if (in_stack_fffffffffff0bb80 != (float *)0x0) {
      operator_delete(in_stack_fffffffffff0bb80);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int model::load_model(string & file_path) {
    FILE * fin = fopen(file_path.c_str(), "r");
    if (!fin) {
        printf("Cannot open file %s to read!\n", file_path.c_str());
        return 1;
    }
    printf("Load model from %s\n", file_path.c_str());

    char buff1[BUFF_SIZE_SHORT];

    //load num_features
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    num_features = (unsigned long)atol(buff1);

    //load alpha, beta, lambda1, lambda2
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    vector<float> params = readFromSep<float>(buff1, ' ');
    alpha = params[0], beta = params[1], lambda1 = params[2], lambda2 = params[3];

    init_model();

    //loda z_intercept, n_intercept, w_intercept
    fgets(buff1, BUFF_SIZE_SHORT - 1, fin);
    vector<float> intercepts = readFromSep<float>(buff1, ' ');
    z_intercept = intercepts[0], n_intercept = intercepts[1], w_intercept = intercepts[2];

    char buff2[BUFF_SIZE_LONG];

    //load z
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    z = libsvm2sparse<float>(buff2, num_features);

    //load n
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    n = libsvm2sparse<float>(buff2, num_features);

    //load w
    fgets(buff2, BUFF_SIZE_LONG - 1, fin);
    w = libsvm2sparse<float>(buff2, num_features);

    fclose(fin);
    return 0;
}